

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Jump(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  int iVar1;
  PClass *pPVar2;
  uint uVar3;
  PClass *pPVar4;
  PClassActor *cls;
  FState *val;
  char *pcVar5;
  undefined8 *puVar6;
  bool bVar7;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_003c9e81:
      pcVar5 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003c9e9a;
    }
    puVar6 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar6 != (undefined8 *)0x0) {
        pPVar4 = (PClass *)puVar6[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*puVar6)(puVar6);
          puVar6[1] = pPVar4;
        }
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c9e9a;
        }
      }
    }
    else if (puVar6 != (undefined8 *)0x0) goto LAB_003c9e81;
    pPVar2 = AActor::RegistrationInfo.MyClass;
    if (numparam == 1) goto LAB_003c9e8a;
    if (param[1].field_0.field_3.Type != '\x03') goto LAB_003c9e81;
    puVar6 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar6 == (undefined8 *)0x0) goto LAB_003c9d4e;
      pPVar4 = (PClass *)puVar6[1];
      if (pPVar4 == (PClass *)0x0) {
        pPVar4 = (PClass *)(**(code **)*puVar6)(puVar6);
        puVar6[1] = pPVar4;
      }
      bVar7 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar2 && bVar7) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar7 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar2) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (!bVar7) {
        pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003c9e9a;
      }
    }
    else {
      if (puVar6 != (undefined8 *)0x0) goto LAB_003c9e81;
LAB_003c9d4e:
      puVar6 = (undefined8 *)0x0;
    }
    if (2 < numparam) {
      if (param[2].field_0.field_3.Type == '\x03') {
        if (numparam == 3) {
          pcVar5 = "(paramnum) < numparam";
        }
        else {
          if (param[3].field_0.field_3.Type == '\0') {
            if ((4 < (uint)numparam) &&
               ((iVar1 = param[3].field_0.i, 0xff < iVar1 ||
                (uVar3 = FRandom::GenRand32(&pr_cajump), (int)(uVar3 & 0xff) < iVar1)))) {
              uVar3 = 4;
              if (numparam - 4U != 1) {
                uVar3 = FRandom::GenRand32(&pr_cajump);
                uVar3 = (uVar3 & 0xff) % (numparam - 4U) + 4;
              }
              if (uVar3 < (uint)numparam) {
                if (param[uVar3].field_0.field_3.Type == '\0') {
                  iVar1 = param[uVar3].field_0.i;
                  cls = (PClassActor *)puVar6[1];
                  if (cls == (PClassActor *)0x0) {
                    cls = (PClassActor *)(**(code **)*puVar6)(puVar6);
                    puVar6[1] = cls;
                  }
                  val = FStateLabelStorage::GetState(&StateLabels,iVar1,cls,false);
                  if (numret < 1) {
                    return 0;
                  }
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                  ,0x49b,
                                  "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  goto LAB_003c9e5a;
                }
                pcVar5 = "param[paramnum + jumpnum].Type == REGT_INT";
              }
              else {
                pcVar5 = "(paramnum + jumpnum) < numparam";
              }
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x49a,
                            "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x49d,
                            "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            val = (FState *)0x0;
LAB_003c9e5a:
            VMReturn::SetPointer(ret,val,0);
            return 1;
          }
          pcVar5 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x493,
                      "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar5 = "param[paramnum].Type == REGT_POINTER";
      goto LAB_003c9e9a;
    }
  }
LAB_003c9e8a:
  pcVar5 = "(paramnum) < numparam";
LAB_003c9e9a:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Jump)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(maxchance);

	paramnum++;		// Increment paramnum to point at the first jump target
	int count = numparam - paramnum;
	if (count > 0 && (maxchance >= 256 || pr_cajump() < maxchance))
	{
		int jumpnum = (count == 1 ? 0 : (pr_cajump() % count));
		PARAM_STATE_ACTION_AT(paramnum + jumpnum, jumpto);
		ACTION_RETURN_STATE(jumpto);
	}
	ACTION_RETURN_STATE(NULL);
}